

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Str_t *
Acb_GeneratePatch(Acb_Ntk_t *p,Vec_Int_t *vDivs,Vec_Int_t *vUsed,Vec_Ptr_t *vSops,Vec_Ptr_t *vGias,
                 Vec_Int_t *vTars)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int i;
  Vec_Wec_t *vGates;
  Vec_Ptr_t *p_00;
  Vec_Str_t *p_01;
  Vec_Int_t *pVVar10;
  Vec_Int_t *vObjsDerefed;
  Vec_Int_t *pVVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  char *pcVar14;
  char *pcVar15;
  void *pvVar16;
  uint uVar17;
  uint uVar18;
  uint nNodes;
  uint uVar19;
  long lVar20;
  uint local_dc;
  int nGates1 [5];
  uint local_c4;
  ulong local_c0;
  ulong local_98;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *vDrf;
  
  if (vGias == (Vec_Ptr_t *)0x0) {
    vGates = Abc_SopSynthesize(vSops);
    vGias = vSops;
  }
  else {
    vGates = Abc_GiaSynthesize(vGias,(Gia_Man_t *)0x0);
  }
  uVar1 = vGias->nSize;
  nNodes = vGates->nSize - (vUsed->nSize + uVar1);
  nGates1[0] = 0;
  nGates1[1] = 0;
  nGates1[2] = 0;
  nGates1[3] = 0;
  nGates1[4] = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  p_00 = Acb_GenerateSignalNames(p,vDivs,vUsed,nNodes,vTars,vGates);
  p_01 = Vec_StrAlloc(100);
  pVVar10 = Acb_GetUsedDivs(vDivs,vUsed);
  vObjsDerefed = Acb_GetDerefedNodes(p);
  vDrf = vObjsDerefed;
  pVVar11 = Acb_ObjCollectTfiVec(p,pVVar10);
  pVVar12 = Acb_ObjCollectTfoVec(p,vTars);
  uVar4 = Acb_NtkCountPiBuffers(p,pVVar10);
  uVar5 = Acb_NtkCountPoDrivers(p,vTars);
  if (vObjsDerefed == (Vec_Int_t *)0x0) {
    local_c4 = 0;
  }
  else {
    iVar7 = vTars->nSize;
    iVar6 = Acb_NtkFindMffcSize(p,pVVar10,vObjsDerefed,nGates1);
    local_c4 = iVar6 + iVar7;
  }
  piVar13 = Abc_FrameReadGateCounts();
  for (lVar20 = 0; lVar20 != 5; lVar20 = lVar20 + 1) {
    nGates1[lVar20] = nGates1[lVar20] + piVar13[lVar20];
  }
  Vec_IntFree(pVVar10);
  uVar17 = vUsed->nSize;
  local_dc = 0;
  local_98 = 0;
  local_c0 = 0;
  uVar19 = uVar17;
  for (; iVar7 = (int)local_98, (int)uVar17 < (int)(uVar19 + nNodes); uVar17 = uVar17 + 1) {
    pVVar10 = Vec_WecEntry(vGates,uVar17);
    iVar6 = pVVar10->nSize;
    iVar8 = Vec_IntEntry(pVVar10,0);
    if (iVar6 < 3) {
      piVar13 = (int *)((long)&local_58 + (ulong)(iVar8 == 8) * 4);
      *piVar13 = *piVar13 + 1;
    }
    else {
      pcVar14 = Acb_Oper2Name(iVar8);
      iVar6 = strcmp(pcVar14,"buf");
      if (iVar6 == 0) {
        local_dc = local_dc + 1;
      }
      else {
        iVar6 = strcmp(pcVar14,"not");
        if (iVar6 == 0) {
          local_98 = (ulong)(iVar7 + 1);
        }
        else {
          local_c0 = (ulong)(((int)local_c0 + pVVar10->nSize) - 3);
        }
      }
    }
    uVar19 = vUsed->nSize;
  }
  Vec_StrPrintF(p_01,
                "// Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n",
                (ulong)uVar19,(ulong)uVar1,(ulong)uVar4,(ulong)uVar5,(ulong)(uint)pVVar11->nSize,
                (ulong)(uint)pVVar12->nSize);
  uVar3 = local_58;
  iVar6 = (int)local_58;
  uVar17 = local_58._4_4_;
  Vec_StrPrintF(p_01,
                "// Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                (ulong)nNodes,local_58 & 0xffffffff,(ulong)local_58._4_4_,(ulong)local_dc,local_98);
  if (vObjsDerefed != (Vec_Int_t *)0x0) {
    Vec_StrPrintF(p_01,
                  "// Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                  (ulong)local_c4,nGates1._0_8_ & 0xffffffff,(ulong)nGates1._0_8_ >> 0x20,
                  nGates1._8_8_ & 0xffffffff,(ulong)nGates1._8_8_ >> 0x20,(ulong)(uint)nGates1[4]);
    Vec_StrPrintF(p_01,
                  "// TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                  (ulong)(nNodes - local_c4),(ulong)(uint)(iVar6 - nGates1[0]),
                  (ulong)(uVar17 - nGates1[1]),(ulong)(local_dc - nGates1[2]),
                  (ulong)(uint)(iVar7 - nGates1[3]));
  }
  Vec_StrPrintF(p_01,"\n");
  Vec_StrAppend(p_01,"module patch (");
  if (vTars->nSize == uVar1) {
    uVar19 = uVar1;
    for (iVar8 = 0; iVar8 < (int)uVar19; iVar8 = iVar8 + 1) {
      iVar9 = Vec_IntEntry(vTars,iVar8);
      pcVar14 = ",";
      if (iVar8 == 0) {
        pcVar14 = "";
      }
      pcVar15 = Acb_ObjNameStr(p,iVar9);
      Vec_StrPrintF(p_01,"%s %s",pcVar14,pcVar15);
      uVar19 = vTars->nSize;
    }
    for (iVar8 = 0; iVar8 < vUsed->nSize; iVar8 = iVar8 + 1) {
      iVar9 = Vec_IntEntry(vUsed,iVar8);
      iVar9 = Vec_IntEntry(vDivs,iVar9);
      pcVar14 = Acb_ObjNameStr(p,iVar9);
      Vec_StrPrintF(p_01,", %s",pcVar14);
    }
    Vec_StrAppend(p_01," );\n\n");
    Vec_StrAppend(p_01,"  output");
    for (iVar8 = 0; iVar8 < vTars->nSize; iVar8 = iVar8 + 1) {
      iVar9 = Vec_IntEntry(vTars,iVar8);
      pcVar14 = ",";
      if (iVar8 == 0) {
        pcVar14 = "";
      }
      pcVar15 = Acb_ObjNameStr(p,iVar9);
      Vec_StrPrintF(p_01,"%s %s",pcVar14,pcVar15);
    }
    Vec_StrAppend(p_01,";\n");
    Vec_StrAppend(p_01,"  input");
    for (iVar8 = 0; iVar8 < vUsed->nSize; iVar8 = iVar8 + 1) {
      iVar9 = Vec_IntEntry(vUsed,iVar8);
      iVar9 = Vec_IntEntry(vDivs,iVar9);
      pcVar14 = ",";
      if (iVar8 == 0) {
        pcVar14 = "";
      }
      pcVar15 = Acb_ObjNameStr(p,iVar9);
      Vec_StrPrintF(p_01,"%s %s",pcVar14,pcVar15);
    }
    Vec_StrAppend(p_01,";\n");
    if ((int)uVar1 < (int)nNodes) {
      Vec_StrAppend(p_01,"  wire");
      uVar18 = 0;
      uVar19 = 0;
      if (0 < (int)nNodes) {
        uVar19 = nNodes;
      }
      bVar2 = true;
      for (; uVar19 != uVar18; uVar18 = uVar18 + 1) {
        pcVar14 = (char *)Vec_PtrEntry(p_00,vUsed->nSize + uVar18);
        if ((*pcVar14 == 'w') && (pcVar14[1] == 'w')) {
          pcVar15 = "";
          if (!bVar2) {
            pcVar15 = ",";
          }
          bVar2 = false;
          Vec_StrPrintF(p_01,"%s %s",pcVar15,pcVar14);
        }
      }
      Vec_StrAppend(p_01,";\n\n");
    }
    iVar8 = vUsed->nSize;
    iVar9 = iVar8;
    local_40 = vUsed;
    do {
      if ((int)(iVar8 + nNodes) <= iVar9) {
        Vec_StrAppend(p_01,"\nendmodule\n\n");
        Vec_StrPush(p_01,'\0');
        Vec_PtrFreeFree(p_00);
        Vec_WecFree(vGates);
        putchar(10);
        printf("Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n",
               (ulong)(uint)vUsed->nSize,(ulong)uVar1,(ulong)uVar4,(ulong)uVar5,
               (ulong)(uint)pVVar11->nSize,(ulong)(uint)pVVar12->nSize);
        printf("Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
               (ulong)nNodes,uVar3 & 0xffffffff,(ulong)uVar17,(ulong)local_dc,local_98,local_c0);
        if (vObjsDerefed != (Vec_Int_t *)0x0) {
          printf("Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                 (ulong)local_c4,nGates1._0_8_ & 0xffffffff,(ulong)nGates1._0_8_ >> 0x20,
                 nGates1._8_8_ & 0xffffffff,(ulong)nGates1._8_8_ >> 0x20,(ulong)(uint)nGates1[4]);
          printf("TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                 (ulong)(nNodes - local_c4),(ulong)(uint)(iVar6 - nGates1[0]),
                 (ulong)(uVar17 - nGates1[1]),(ulong)(local_dc - nGates1[2]),
                 (ulong)(uint)(iVar7 - nGates1[3]),(ulong)(uint)((int)local_c0 - nGates1[4]));
        }
        putchar(10);
        Vec_IntFreeP(&vDrf);
        return p_01;
      }
      pVVar10 = Vec_WecEntry(vGates,iVar9);
      iVar8 = pVVar10->nSize;
      i = Vec_IntEntry(pVVar10,0);
      if (iVar8 < 3) {
        if (i != 7) {
          iVar8 = Vec_IntEntry(pVVar10,0);
          if (iVar8 != 8) {
            __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                          ,0x7f0,
                          "Vec_Str_t *Acb_GeneratePatch(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)"
                         );
          }
        }
        Vec_StrPrintF(p_01,"  %s (","buf");
        iVar8 = Vec_IntEntry(pVVar10,1);
        pvVar16 = Vec_PtrEntry(p_00,iVar8);
        Vec_StrPrintF(p_01," %s, ",pvVar16);
        iVar8 = Vec_IntEntry(pVVar10,0);
        Vec_StrPrintF(p_01," 1\'b%d",(ulong)(iVar8 == 8));
        Vec_StrPrintF(p_01," );\n");
      }
      else {
        pcVar14 = Acb_Oper2Name(i);
        Vec_StrPrintF(p_01,"  %s (",pcVar14);
        for (uVar19 = 1; (int)uVar19 < pVVar10->nSize; uVar19 = uVar19 + 1) {
          iVar8 = Vec_IntEntry(pVVar10,uVar19);
          pcVar14 = "";
          if (1 < uVar19) {
            pcVar14 = ",";
          }
          pvVar16 = Vec_PtrEntry(p_00,iVar8);
          Vec_StrPrintF(p_01,"%s %s",pcVar14,pvVar16);
        }
        Vec_StrAppend(p_01," );\n");
        vUsed = local_40;
      }
      iVar9 = iVar9 + 1;
      iVar8 = vUsed->nSize;
    } while( true );
  }
  __assert_fail("Vec_IntSize(vTars) == nOuts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                ,0x7c7,
                "Vec_Str_t *Acb_GeneratePatch(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)"
               );
}

Assistant:

Vec_Str_t * Acb_GeneratePatch( Acb_Ntk_t * p, Vec_Int_t * vDivs, Vec_Int_t * vUsed, Vec_Ptr_t * vSops, Vec_Ptr_t * vGias, Vec_Int_t * vTars )
{
    extern Vec_Wec_t * Abc_SopSynthesize( Vec_Ptr_t * vSops );
    extern Vec_Wec_t * Abc_GiaSynthesize( Vec_Ptr_t * vGias, Gia_Man_t * pMulti );
    Vec_Wec_t * vGates = vGias ? Abc_GiaSynthesize(vGias, NULL) : Abc_SopSynthesize(vSops);  Vec_Int_t * vGate;
    int nOuts = vGias ? Vec_PtrSize(vGias) : Vec_PtrSize(vSops);
    int i, k, iObj, nWires = Vec_WecSize(vGates) - Vec_IntSize(vUsed) - nOuts, fFirst = 1;
    int nGates1[5] = {0}, nGates0[5] = {0};
    Vec_Ptr_t * vNames = Acb_GenerateSignalNames( p, vDivs, vUsed, nWires, vTars, vGates );
    Vec_Str_t * vStr = Vec_StrAlloc( 100 );
    Vec_Int_t * vSup = Acb_GetUsedDivs( vDivs, vUsed );
    Vec_Int_t * vDrf = Acb_GetDerefedNodes( p );
    Vec_Int_t * vTfi = Acb_ObjCollectTfiVec( p, vSup );
    Vec_Int_t * vTfo = Acb_ObjCollectTfoVec( p, vTars );
    int nPiCount = Acb_NtkCountPiBuffers( p, vSup );
    int nPoCount = Acb_NtkCountPoDrivers( p, vTars );
    int nMffc    = vDrf ? Vec_IntSize(vTars) + Acb_NtkFindMffcSize( p, vSup, vDrf, nGates1 ) : 0;
    int * pCounts = Abc_FrameReadGateCounts();
    for ( i = 0; i < 5; i++ )
        nGates1[i] += pCounts[i];
    Vec_IntFree( vSup );
    Vec_WecForEachLevelStartStop( vGates, vGate, i, Vec_IntSize(vUsed), Vec_IntSize(vUsed)+nWires )
    {
        if ( Vec_IntSize(vGate) > 2 )
        {
            char * pName = Acb_Oper2Name(Vec_IntEntry(vGate, 0));
            if ( !strcmp(pName, "buf") )
                nGates0[2]++;
            else if ( !strcmp(pName, "not") )
                nGates0[3]++;
            else
                nGates0[4] += Vec_IntSize(vGate) - 3;
        }
        else
            nGates0[Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T]++;
    }

    Vec_StrPrintF( vStr, "// Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n", Vec_IntSize(vUsed), nOuts, nPiCount, nPoCount, Vec_IntSize(vTfi), Vec_IntSize(vTfo) );
    Vec_StrPrintF( vStr, "// Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires,         nGates0[0], nGates0[1], nGates0[2], nGates0[3], nGates0[4] ); 
    if ( vDrf != NULL )
    Vec_StrPrintF( vStr, "// Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nMffc,          nGates1[0], nGates1[1], nGates1[2], nGates1[3], nGates1[4] ); 
    if ( vDrf != NULL )
    Vec_StrPrintF( vStr, "// TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires-nMffc, nGates0[0]-nGates1[0],  nGates0[1]-nGates1[1],  nGates0[2]-nGates1[2], nGates0[3]-nGates1[3], nGates0[4]-nGates1[4] ); 
    Vec_StrPrintF( vStr, "\n" );

    Vec_StrAppend( vStr, "module patch (" );

    assert( Vec_IntSize(vTars) == nOuts );
    Vec_IntForEachEntry( vTars, iObj, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", Acb_ObjNameStr(p, iObj) );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_StrPrintF( vStr, ", %s", Acb_ObjNameStr(p, iObj) );
    Vec_StrAppend( vStr, " );\n\n" );

    Vec_StrAppend( vStr, "  output" );
    Vec_IntForEachEntry( vTars, iObj, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", Acb_ObjNameStr(p, iObj) );
    Vec_StrAppend( vStr, ";\n" );

    Vec_StrAppend( vStr, "  input" );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", Acb_ObjNameStr(p, iObj) );
    Vec_StrAppend( vStr, ";\n" );

    if ( nWires > nOuts )
    {
        Vec_StrAppend( vStr, "  wire" );
        for ( i = 0; i < nWires; i++ )
        {
            char * pName = (char *)Vec_PtrEntry( vNames, Vec_IntSize(vUsed)+i );
            if ( !strncmp(pName, "ww", 2) )
                Vec_StrPrintF( vStr, "%s %s", fFirst ? "":",", pName ), fFirst = 0;
        }
        Vec_StrAppend( vStr, ";\n\n" );
    }

    // create internal nodes
    Vec_WecForEachLevelStartStop( vGates, vGate, i, Vec_IntSize(vUsed), Vec_IntSize(vUsed)+nWires )
    {
        if ( Vec_IntSize(vGate) > 2 )
        {
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name(Vec_IntEntry(vGate, 0)) );
            Vec_IntForEachEntryStart( vGate, iObj, k, 1 )
                Vec_StrPrintF( vStr, "%s %s", k > 1 ? ",":"", (char *)Vec_PtrEntry(vNames, iObj) );
            Vec_StrAppend( vStr, " );\n" );
        }
        else
        {
            assert( Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name( ABC_OPER_BIT_BUF ) );
            Vec_StrPrintF( vStr, " %s, ", (char *)Vec_PtrEntry(vNames, Vec_IntEntry(vGate, 1)) );
            Vec_StrPrintF( vStr, " 1\'b%d", Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, " );\n" );
        }
    }
    Vec_StrAppend( vStr, "\nendmodule\n\n" );
    Vec_StrPush( vStr, '\0' );
    Vec_PtrFreeFree( vNames );
    Vec_WecFree( vGates );

//    printf( "Synthesized patch with %d inputs, %d outputs and %d gates (const = %d  buf = %d  inv = %d  other = %d).\n", 
//        Vec_IntSize(vUsed), nOuts, nWires, nConst, nBufs, nInvs, nNodes );
//    printf( "Summary of the results\n" );
    printf( "\n" );
    printf( "Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n", Vec_IntSize(vUsed), nOuts, nPiCount, nPoCount, Vec_IntSize(vTfi), Vec_IntSize(vTfo) );
    printf( "Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires,         nGates0[0], nGates0[1], nGates0[2], nGates0[3], nGates0[4] ); 
    if ( vDrf != NULL )
    printf( "Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nMffc,          nGates1[0], nGates1[1], nGates1[2], nGates1[3], nGates1[4] ); 
    if ( vDrf != NULL )
    printf( "TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires-nMffc,   nGates0[0]-nGates1[0],  nGates0[1]-nGates1[1],  nGates0[2]-nGates1[2], nGates0[3]-nGates1[3], nGates0[4]-nGates1[4] ); 
    printf( "\n" );
    Vec_IntFreeP( &vDrf );
    return vStr;
}